

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O2

void __thiscall lts2::LBDOperator::ApplyConjugate(LBDOperator *this,Mat *X,Mat *AstarX)

{
  long lVar1;
  long lVar2;
  _InputArray local_d8;
  Scalar_<double> local_c0;
  Size local_a0;
  Size local_98;
  Mat basisImage;
  
  local_98 = this->_patchSize;
  cv::Mat::create(AstarX,&local_98,5);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&basisImage,0.0);
  local_c0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = -0x3efdfffa;
  local_c0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 8.48798316435515e-314;
  local_c0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&basisImage;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)AstarX,(_InputArray *)&local_c0);
  local_a0 = this->_patchSize;
  cv::Scalar_<double>::Scalar_(&local_c0,0.0);
  cv::Mat::Mat(&basisImage,&local_a0,5,&local_c0);
  lVar1 = *(long *)(X + 0x10);
  for (lVar2 = 0; (uint)lVar2 < *(uint *)&(this->super_LinearOperator).field_0xc; lVar2 = lVar2 + 1)
  {
    cv::Scalar_<double>::Scalar_(&local_c0,0.0);
    local_d8.flags = -0x3efdfffa;
    local_d8.sz.width = 1;
    local_d8.sz.height = 4;
    local_d8.obj = (_InputArray *)&local_c0;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)&basisImage,&local_d8);
    fillBasisFunctionForIndex(this,&basisImage,(uint)lVar2);
    local_c0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
    local_c0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x2010000;
    local_c0.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)&basisImage;
    cv::Mat::convertTo((_OutputArray *)&basisImage,(int)(_InputArray *)&local_c0,
                       (double)*(float *)(lVar1 + lVar2 * 4),0.0);
    cv::operator+=(AstarX,&basisImage);
  }
  cv::Mat::~Mat(&basisImage);
  return;
}

Assistant:

void lts2::LBDOperator::ApplyConjugate(cv::Mat const& X, cv::Mat& AstarX)
{
    // The output is an image (actually, a patch)
    AstarX.create(_patchSize, CV_32F);
    AstarX.setTo(cv::Scalar(0));

    // Stub to hold the current image basis function: we will write
    // each basis function into it
    cv::Mat basisImage(_patchSize, CV_32F, cv::Scalar(0));
    
    // Coordinate value
    float const* p_x = X.ptr<float>(0);
    
    // Sum over the basis functions
    for (int i = 0; i < _pairsInUse; ++i)
    {
        // Reset
        basisImage.setTo(cv::Scalar(0));
        
        // Add "nominal" basis function
        fillBasisFunctionForIndex(basisImage, i);
        
        // Apply the amplitude
        basisImage *= (*p_x);
        ++p_x;
        
        // Sum
        AstarX += basisImage;
    }
}